

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519.c
# Opt level: O0

void ed25519_sign(uchar *m,size_t mlen,uchar *sk,uchar *pk,uchar *RS)

{
  uchar local_308 [8];
  hash_512bits hram;
  hash_512bits hashr;
  hash_512bits extsk;
  ge25519 R;
  bignum256modm a;
  bignum256modm_element_t local_178;
  bignum256modm S;
  bignum256modm_element_t local_148;
  bignum256modm r;
  undefined1 local_118 [8];
  ed25519_hash_context ctx;
  uchar *RS_local;
  uchar *pk_local;
  uchar *sk_local;
  size_t mlen_local;
  uchar *m_local;
  
  ctx._208_8_ = RS;
  ed25519_hash(hashr + 0x38,sk,0x20);
  hashr[0x38] = hashr[0x38] & 0xf8;
  extsk[0x17] = extsk[0x17] & 0x7f | 0x40;
  ed25519_hash_init((ed25519_hash_context *)local_118);
  ed25519_hash_update((ed25519_hash_context *)local_118,extsk + 0x18,0x20);
  ed25519_hash_update((ed25519_hash_context *)local_118,m,mlen);
  ed25519_hash_final((ed25519_hash_context *)local_118,hram + 0x38);
  expand256_modm(&local_148,hram + 0x38,0x40);
  ge25519_scalarmult_base_niels((ge25519 *)(extsk + 0x38),ge25519_niels_base_multiples,&local_148);
  ge25519_pack((uchar *)ctx._208_8_,(ge25519 *)(extsk + 0x38));
  ed25519_hram(local_308,(uchar *)ctx._208_8_,pk,m,mlen);
  expand256_modm(&local_178,local_308,0x40);
  expand256_modm(R.t + 4,hashr + 0x38,0x20);
  mul256_modm(&local_178,&local_178,R.t + 4);
  add256_modm(&local_178,&local_178,&local_148);
  contract256_modm((uchar *)(ctx._208_8_ + 0x20),&local_178);
  return;
}

Assistant:

ge25519 ALIGN(16) R;
	hash_512bits extsk, hashr, hram;

	ed25519_extsk(extsk, sk);

	/* r = H(aExt[32..64], m) */
	ed25519_hash_init(&ctx);
	ed25519_hash_update(&ctx, extsk + 32, 32);
	ed25519_hash_update(&ctx, m, mlen);
	ed25519_hash_final(&ctx, hashr);
	expand256_modm(r, hashr, 64);

	/* R = rB */
	ge25519_scalarmult_base_niels(&R, ge25519_niels_base_multiples, r);
	ge25519_pack(RS, &R);

	/* S = H(R,A,m).. */
	ed25519_hram(hram, RS, pk, m, mlen);
	expand256_modm(S, hram, 64);

	/* S = H(R,A,m)a */
	expand256_modm(a, extsk, 32);
	mul256_modm(S, S, a);

	/* S = (r + H(R,A,m)a) */
	add256_modm(S, S, r);

	/* S = (r + H(R,A,m)a) mod L */	
	contract256_modm(RS + 32, S);
}

int
ED25519_FN(ed25519_sign_open) (const unsigned char *m, size_t mlen, const ed25519_public_key pk, const ed25519_signature RS) {
	ge25519 ALIGN(16) R, A;
	hash_512bits hash;
	bignum256modm hram, S;
	unsigned char checkR[32];

	if ((RS[63] & 224) || !ge25519_unpack_negative_vartime(&A, pk))
		return -1;

	/* hram = H(R,A,m) */
	ed25519_hram(hash, RS, pk, m, mlen);
	expand256_modm(hram, hash, 64);

	/* S */
	expand256_modm(S, RS + 32, 32);

	/* SB - H(R,A,m)A */
	ge25519_double_scalarmult_vartime(&R, &A, hram, S);
	ge25519_pack(checkR, &R);

	/* check that R = SB - H(R,A,m)A */
	return ed25519_verify(RS, checkR, 32) ? 0 : -1;
}